

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O2

void __thiscall Js::DynamicObject::ChangeType(DynamicObject *this)

{
  Type *pTVar1;
  InterruptPoller *pIVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  undefined1 local_28 [8];
  AutoDisableInterrupt autoDisableInterrupt;
  
  pTVar1 = (this->super_RecyclableObject).type.ptr;
  local_28 = (undefined1  [8])
             ((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
             threadContext;
  autoDisableInterrupt.m_threadContext._0_2_ = 0;
  autoDisableInterrupt.m_threadContext._2_1_ = 1;
  pIVar2 = ((ThreadContext *)local_28)->interruptPoller;
  if (pIVar2 != (InterruptPoller *)0x0) {
    autoDisableInterrupt.m_threadContext._0_2_ = (ushort)pIVar2->isDisabled << 8;
    pIVar2->isDisabled = true;
  }
  if ((*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01') &&
     ((*(byte *)(*(long *)(pTVar1 + 1) + 9) & 0x10) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x26a,
                                "(!GetDynamicType()->GetIsShared() || GetTypeHandler()->GetIsShared())"
                                ,
                                "!GetDynamicType()->GetIsShared() || GetTypeHandler()->GetIsShared()"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  iVar5 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x67])(this);
  Memory::WriteBarrierPtr<Js::Type>::WriteBarrierSet
            (&(this->super_RecyclableObject).type,(Type *)CONCAT44(extraout_var,iVar5));
  autoDisableInterrupt.m_threadContext._0_1_ = 1;
  AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)local_28);
  return;
}

Assistant:

void DynamicObject::ChangeType()
    {
        // Allocation won't throw any more, otherwise we should use AutoDisableInterrupt to guard here
        AutoDisableInterrupt autoDisableInterrupt(this->GetScriptContext()->GetThreadContext());

        Assert(!GetDynamicType()->GetIsShared() || GetTypeHandler()->GetIsShared());
        this->type = this->DuplicateType();
        autoDisableInterrupt.Completed();
    }